

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::on_format_specs(format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                  *this,char *begin,char *end)

{
  size_t *psVar1;
  basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>
  *pbVar2;
  char *pcVar3;
  char *pcVar4;
  basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_RCX;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>_>
  handler;
  basic_format_specs<char> local_b8;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>_>
  local_a0;
  type local_88;
  char *local_68;
  size_t sStack_60;
  size_t local_58;
  undefined8 uStack_50;
  void *local_48;
  undefined1 *local_40;
  basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>
  *local_38;
  
  local_a0.
  super_specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  .super_specs_setter<char>.specs_ = &local_b8;
  pcVar4 = (this->context).
           super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
           .parse_context_.format_str_.data_;
  (this->context).
  super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
  .parse_context_.format_str_.data_ = begin;
  psVar1 = &(this->context).
            super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
            .parse_context_.format_str_.size_;
  *psVar1 = (size_t)(pcVar4 + (*psVar1 - (long)begin));
  pbVar2 = &this->context;
  if ((this->arg).type_ == custom_type) {
    (*(this->arg).value_.field_0.custom.format)
              ((void *)(this->arg).value_.field_0.long_long_value,pbVar2);
    pcVar4 = (this->context).
             super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
             .parse_context_.format_str_.data_;
  }
  else {
    local_b8.super_align_spec.width_ = 0;
    local_b8.super_align_spec.fill_ = L' ';
    local_b8.super_align_spec.align_ = ALIGN_DEFAULT;
    local_b8.super_core_format_specs.precision = -1;
    local_b8.super_core_format_specs.flags = '\0';
    local_b8.super_core_format_specs.type = '\0';
    local_a0.arg_type_ = (this->arg).type_;
    local_a0.
    super_specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
    .context_ = pbVar2;
    pcVar4 = internal::
             parse_format_specs<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>>&>
                       (begin,end,&local_a0);
    if ((pcVar4 == end) || (*pcVar4 != '}')) {
      internal::error_handler::on_error((error_handler *)this,"missing \'}\' in format string");
    }
    pcVar3 = (this->context).
             super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
             .parse_context_.format_str_.data_;
    (this->context).
    super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
    .parse_context_.format_str_.data_ = pcVar4;
    psVar1 = &(this->context).
              super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
              .parse_context_.format_str_.size_;
    *psVar1 = (size_t)(pcVar3 + (*psVar1 - (long)pcVar4));
    local_48 = (this->context).
               super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
               .loc_.locale_;
    local_68 = (this->context).
               super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
               .out_.super_truncating_iterator_base<char_*>.out_;
    sStack_60 = (this->context).
                super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
                .out_.super_truncating_iterator_base<char_*>.limit_;
    local_58 = (this->context).
               super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
               .out_.super_truncating_iterator_base<char_*>.count_;
    uStack_50 = *(undefined8 *)
                 &(this->context).
                  super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
                  .out_.blackhole_;
    local_40 = (undefined1 *)&local_b8;
    local_38 = pbVar2;
    visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
              (&local_88,(v5 *)&local_68,
               (arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                *)&this->arg,in_RCX);
    *(ulong *)((long)&(this->context).
                      super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
                      .out_.super_truncating_iterator_base<char_*>.limit_ + 1) =
         CONCAT17((undefined1)local_88.super_truncating_iterator_base<char_*>.count_,
                  local_88.super_truncating_iterator_base<char_*>.limit_._1_7_);
    *(undefined8 *)
     ((long)&(this->context).
             super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
             .out_.super_truncating_iterator_base<char_*>.count_ + 1) = local_88._17_8_;
    (this->context).
    super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
    .out_.super_truncating_iterator_base<char_*>.out_ =
         local_88.super_truncating_iterator_base<char_*>.out_;
    (this->context).
    super_context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
    .out_.super_truncating_iterator_base<char_*>.limit_ =
         CONCAT71(local_88.super_truncating_iterator_base<char_*>.limit_._1_7_,
                  (undefined1)local_88.super_truncating_iterator_base<char_*>.limit_);
  }
  return pcVar4;
}

Assistant:

const Char *on_format_specs(const Char *begin, const Char *end) {
    auto &parse_ctx = context.parse_context();
    parse_ctx.advance_to(begin);
    internal::custom_formatter<Char, Context> f(context);
    if (visit_format_arg(f, arg))
      return parse_ctx.begin();
    basic_format_specs<Char> specs;
    using internal::specs_handler;
    internal::specs_checker<specs_handler<Context>>
        handler(specs_handler<Context>(specs, context), arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}')
      on_error("missing '}' in format string");
    parse_ctx.advance_to(begin);
    context.advance_to(visit_format_arg(ArgFormatter(context, &specs), arg));
    return begin;
  }